

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O1

int mtree_entry_new(archive_write *a,archive_entry *entry,mtree_entry_conflict **m_entry)

{
  archive_string *as;
  int iVar1;
  uint uVar2;
  mode_t mVar3;
  mtree_entry_conflict *me;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  la_int64_t lVar9;
  time_t tVar10;
  dev_t dVar11;
  dir_info *pdVar12;
  reg_info *prVar13;
  long lVar14;
  size_t sVar15;
  char *pcVar16;
  bool bVar17;
  archive_string local_48;
  
  me = (mtree_entry_conflict *)calloc(1,0x150);
  if (me != (mtree_entry_conflict *)0x0) {
    (me->pathname).length = 0;
    pcVar4 = archive_entry_pathname(entry);
    pcVar5 = archive_entry_pathname(entry);
    if (pcVar5 == (char *)0x0) {
      sVar6 = 0;
    }
    else {
      pcVar5 = archive_entry_pathname(entry);
      sVar6 = strlen(pcVar5);
    }
    archive_strncat(&me->pathname,pcVar4,sVar6);
    pcVar4 = (me->pathname).s;
    iVar1 = strcmp(pcVar4,".");
    if (iVar1 != 0) {
      as = &me->parentdir;
      (me->parentdir).length = 0;
      if (pcVar4 == (char *)0x0) {
        sVar6 = 0;
      }
      else {
        sVar6 = strlen(pcVar4);
      }
      archive_strncat(as,pcVar4,sVar6);
      pcVar5 = (me->parentdir).s;
      sVar15 = (me->parentdir).length;
      pcVar4 = pcVar5;
      do {
        if (*pcVar4 == '/') {
          lVar7 = -1;
          lVar14 = 1;
        }
        else {
          if (((*pcVar4 != '.') || (pcVar4[1] != '.')) || (pcVar4[2] != '/')) goto LAB_004a96cc;
          lVar7 = -3;
          lVar14 = 3;
        }
        pcVar4 = pcVar4 + lVar14;
        sVar15 = sVar15 + lVar7;
      } while( true );
    }
    (me->basename).length = 0;
    archive_strncat(&me->basename,".",1);
    goto LAB_004a98f7;
  }
  goto LAB_004a9b3a;
LAB_004a96cc:
  if (pcVar4 != pcVar5) {
    memmove(pcVar5,pcVar4,sVar15 + 1);
    pcVar4 = pcVar5;
  }
  do {
    if (sVar15 == 0) break;
    uVar8 = sVar15;
    if (pcVar4[sVar15 - 1] == '/') {
      uVar8 = sVar15 - 1;
      pcVar4[uVar8] = '\0';
    }
    if (((1 < uVar8) && (pcVar4[uVar8 - 2] == '/')) && (pcVar4[uVar8 - 1] == '.')) {
      uVar8 = uVar8 - 2;
      pcVar4[uVar8] = '\0';
    }
    if (((2 < uVar8) && (pcVar4[uVar8 - 3] == '/')) &&
       ((pcVar4[uVar8 - 2] == '.' && (pcVar4[uVar8 - 1] == '.')))) {
      uVar8 = uVar8 - 3;
      pcVar4[uVar8] = '\0';
    }
    bVar17 = sVar15 != uVar8;
    sVar15 = uVar8;
  } while (bVar17);
LAB_004a97d8:
  pcVar16 = pcVar4;
  if (*pcVar16 == '/') {
    pcVar4 = pcVar16 + 1;
    if (pcVar16[1] == '.') {
      if (pcVar16[2] == '/') {
        pcVar4 = pcVar16 + 2;
        goto LAB_004a9784;
      }
      if ((pcVar16[2] == '.') && (pcVar16[3] == '/')) {
        pcVar4 = pcVar16;
        do {
          pcVar4 = pcVar4 + -1;
          if (pcVar4 < pcVar5) break;
        } while (*pcVar4 != '/');
        if (pcVar5 < pcVar4) {
          strcpy(pcVar4,pcVar16 + 3);
        }
        else {
          strcpy(pcVar5,pcVar16 + 4);
          pcVar4 = pcVar5;
        }
      }
    }
    else if (pcVar16[1] == '/') {
LAB_004a9784:
      strcpy(pcVar16,pcVar4);
      pcVar4 = pcVar16;
    }
    goto LAB_004a97d8;
  }
  if (*pcVar16 != '\0') {
    pcVar4 = pcVar16 + 1;
    goto LAB_004a97d8;
  }
  sVar15 = strlen(pcVar5);
  iVar1 = strcmp(pcVar5,".");
  if ((iVar1 != 0) && (iVar1 = strncmp(pcVar5,"./",2), iVar1 != 0)) {
    local_48.s = (char *)0x0;
    local_48.length = 0;
    local_48.buffer_length = 0;
    archive_strncat(&local_48,"./",2);
    archive_strncat(&local_48,pcVar5,sVar15);
    (me->parentdir).length = 0;
    archive_string_concat(as,&local_48);
    archive_string_free(&local_48);
    pcVar5 = (me->parentdir).s;
    sVar15 = (me->parentdir).length;
  }
  pcVar4 = (char *)0x0;
  for (; (pcVar16 = pcVar5, *pcVar5 == '/' || (pcVar16 = pcVar4, *pcVar5 != '\0'));
      pcVar5 = pcVar5 + 1) {
    pcVar4 = pcVar16;
  }
  if (pcVar4 == (char *)0x0) {
    (me->parentdir).length = sVar15;
    (me->basename).length = 0;
    archive_string_concat(&me->basename,as);
    (me->parentdir).length = 0;
    *(me->parentdir).s = '\0';
  }
  else {
    *pcVar4 = '\0';
    (me->parentdir).length = (long)pcVar4 - (long)(me->parentdir).s;
    (me->basename).length = 0;
    sVar6 = strlen(pcVar4 + 1);
    archive_strncat(&me->basename,pcVar4 + 1,sVar6);
  }
LAB_004a98f7:
  pcVar4 = archive_entry_symlink(entry);
  if (pcVar4 != (char *)0x0) {
    (me->symlink).length = 0;
    sVar6 = strlen(pcVar4);
    archive_strncat(&me->symlink,pcVar4,sVar6);
  }
  uVar2 = archive_entry_nlink(entry);
  me->nlink = uVar2;
  mVar3 = archive_entry_filetype(entry);
  me->filetype = mVar3;
  mVar3 = archive_entry_mode(entry);
  me->mode = mVar3 & 0xfff;
  lVar9 = archive_entry_uid(entry);
  me->uid = lVar9;
  lVar9 = archive_entry_gid(entry);
  me->gid = lVar9;
  pcVar4 = archive_entry_uname(entry);
  if (pcVar4 != (char *)0x0) {
    (me->uname).length = 0;
    sVar6 = strlen(pcVar4);
    archive_strncat(&me->uname,pcVar4,sVar6);
  }
  pcVar4 = archive_entry_gname(entry);
  if (pcVar4 != (char *)0x0) {
    (me->gname).length = 0;
    sVar6 = strlen(pcVar4);
    archive_strncat(&me->gname,pcVar4,sVar6);
  }
  pcVar4 = archive_entry_fflags_text(entry);
  if (pcVar4 != (char *)0x0) {
    (me->fflags_text).length = 0;
    sVar6 = strlen(pcVar4);
    archive_strncat(&me->fflags_text,pcVar4,sVar6);
  }
  archive_entry_fflags(entry,&me->fflags_set,&me->fflags_clear);
  tVar10 = archive_entry_mtime(entry);
  me->mtime = tVar10;
  lVar7 = archive_entry_mtime_nsec(entry);
  me->mtime_nsec = lVar7;
  dVar11 = archive_entry_rdevmajor(entry);
  me->rdevmajor = dVar11;
  dVar11 = archive_entry_rdevminor(entry);
  me->rdevminor = dVar11;
  dVar11 = archive_entry_devmajor(entry);
  me->devmajor = dVar11;
  dVar11 = archive_entry_devminor(entry);
  me->devminor = dVar11;
  lVar9 = archive_entry_ino(entry);
  me->ino = lVar9;
  lVar9 = archive_entry_size(entry);
  me->size = lVar9;
  iVar1 = 0;
  if (me->filetype == 0x8000) {
    prVar13 = (reg_info *)calloc(1,0xd0);
    me->reg_info = prVar13;
    if (prVar13 != (reg_info *)0x0) {
      prVar13->compute_sum = 0;
      goto LAB_004a9b58;
    }
  }
  else {
    if (me->filetype != 0x4000) goto LAB_004a9b58;
    pdVar12 = (dir_info *)calloc(1,0x30);
    me->dir_info = pdVar12;
    if (pdVar12 != (dir_info *)0x0) {
      __archive_rb_tree_init((archive_rb_tree *)pdVar12,&mtree_entry_new::rb_ops);
      pdVar12 = me->dir_info;
      iVar1 = 0;
      (pdVar12->children).first = (mtree_entry_conflict *)0x0;
      (pdVar12->children).last = &(pdVar12->children).first;
      pdVar12->chnext = (mtree_entry_conflict *)0x0;
      goto LAB_004a9b58;
    }
  }
  mtree_entry_free(me);
LAB_004a9b3a:
  me = (mtree_entry_conflict *)0x0;
  archive_set_error(&a->archive,0xc,"Can\'t allocate memory for a mtree entry");
  iVar1 = -0x1e;
LAB_004a9b58:
  *m_entry = me;
  return iVar1;
}

Assistant:

static int
mtree_entry_new(struct archive_write *a, struct archive_entry *entry,
    struct mtree_entry **m_entry)
{
	struct mtree_entry *me;
	const char *s;
	int r;
	static const struct archive_rb_tree_ops rb_ops = {
		mtree_entry_cmp_node, mtree_entry_cmp_key
	};

	me = calloc(1, sizeof(*me));
	if (me == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory for a mtree entry");
		*m_entry = NULL;
		return (ARCHIVE_FATAL);
	}

	r = mtree_entry_setup_filenames(a, me, entry);
	if (r < ARCHIVE_WARN) {
		mtree_entry_free(me);
		*m_entry = NULL;
		return (r);
	}

	if ((s = archive_entry_symlink(entry)) != NULL)
		archive_strcpy(&me->symlink, s);
	me->nlink = archive_entry_nlink(entry);
	me->filetype = archive_entry_filetype(entry);
	me->mode = archive_entry_mode(entry) & 07777;
	me->uid = archive_entry_uid(entry);
	me->gid = archive_entry_gid(entry);
	if ((s = archive_entry_uname(entry)) != NULL)
		archive_strcpy(&me->uname, s);
	if ((s = archive_entry_gname(entry)) != NULL)
		archive_strcpy(&me->gname, s);
	if ((s = archive_entry_fflags_text(entry)) != NULL)
		archive_strcpy(&me->fflags_text, s);
	archive_entry_fflags(entry, &me->fflags_set, &me->fflags_clear);
	me->mtime = archive_entry_mtime(entry);
	me->mtime_nsec = archive_entry_mtime_nsec(entry);
	me->rdevmajor = archive_entry_rdevmajor(entry);
	me->rdevminor = archive_entry_rdevminor(entry);
	me->devmajor = archive_entry_devmajor(entry);
	me->devminor = archive_entry_devminor(entry);
	me->ino = archive_entry_ino(entry);
	me->size = archive_entry_size(entry);
	if (me->filetype == AE_IFDIR) {
		me->dir_info = calloc(1, sizeof(*me->dir_info));
		if (me->dir_info == NULL) {
			mtree_entry_free(me);
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for a mtree entry");
			*m_entry = NULL;
			return (ARCHIVE_FATAL);
		}
		__archive_rb_tree_init(&me->dir_info->rbtree, &rb_ops);
		me->dir_info->children.first = NULL;
		me->dir_info->children.last = &(me->dir_info->children.first);
		me->dir_info->chnext = NULL;
	} else if (me->filetype == AE_IFREG) {
		me->reg_info = calloc(1, sizeof(*me->reg_info));
		if (me->reg_info == NULL) {
			mtree_entry_free(me);
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for a mtree entry");
			*m_entry = NULL;
			return (ARCHIVE_FATAL);
		}
		me->reg_info->compute_sum = 0;
	}

	*m_entry = me;
	return (ARCHIVE_OK);
}